

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O2

void __thiscall pg::NPPSolver::run(NPPSolver *this)

{
  uidlvector *this_00;
  ulong *puVar1;
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *plVar2;
  Game *pGVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  size_t sVar9;
  int iVar10;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  bitset *pbVar11;
  ostream *poVar12;
  uint uVar13;
  long lVar14;
  uint prt;
  uint uVar15;
  int sop;
  ulong uVar16;
  ulong uVar17;
  reference rVar18;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->Phase,true);
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&this->outgame;
  std::vector<pg::bitset*,std::allocator<pg::bitset*>>::emplace_back<pg::bitset*>
            ((vector<pg::bitset*,std::allocator<pg::bitset*>> *)&this->Supgame,(bitset **)&local_88)
  ;
  this_01 = (_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x50);
  (this_01->_M_impl).super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_map_size = 0;
  (this_01->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this_01->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_Deque_base(this_01);
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)this_01;
  std::
  vector<std::deque<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>*>>
  ::emplace_back<std::deque<unsigned_int,std::allocator<unsigned_int>>*>
            ((vector<std::deque<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>*>>
              *)&this->Heads,(deque<unsigned_int,_std::allocator<unsigned_int>_> **)&local_88);
  pbVar11 = (bitset *)operator_new(0x20);
  bitset::bitset(pbVar11,((this->super_Solver).game)->n_vertices);
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)pbVar11;
  std::vector<pg::bitset*,std::allocator<pg::bitset*>>::emplace_back<pg::bitset*>
            ((vector<pg::bitset*,std::allocator<pg::bitset*>> *)&this->Exits,(bitset **)&local_88);
  this_00 = &this->Entries;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)operator_new(0x18);
  local_88._M_impl.super__Deque_impl_data._M_map[1] =
       (uint *)local_88._M_impl.super__Deque_impl_data._M_map;
  *local_88._M_impl.super__Deque_impl_data._M_map =
       (uint *)local_88._M_impl.super__Deque_impl_data._M_map;
  local_88._M_impl.super__Deque_impl_data._M_map[2] = (uint *)0x0;
  std::
  vector<std::__cxx11::list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>*,std::allocator<std::__cxx11::list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>*>>
  ::
  emplace_back<std::__cxx11::list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>*>
            ((vector<std::__cxx11::list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>*,std::allocator<std::__cxx11::list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>*>>
              *)this_00,
             (list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              **)&local_88);
  plVar2 = *(this->Entries).
            super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_Deque_base(&local_88);
  std::__cxx11::
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_front(plVar2,(value_type *)&local_88);
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_88);
  pGVar3 = (this->super_Solver).game;
  puVar4 = (this->outgame)._bits;
  uVar13 = (uint)pGVar3->n_vertices;
  puVar5 = ((this->super_Solver).disabled)->_bits;
  while( true ) {
    uVar13 = uVar13 - 1;
    uVar16 = (ulong)(long)(int)uVar13 >> 6;
    if ((puVar5[uVar16] >> ((ulong)uVar13 & 0x3f) & 1) == 0) break;
    puVar1 = puVar4 + uVar16;
    *puVar1 = *puVar1 | 1L << ((ulong)uVar13 & 0x3f);
  }
  this->pos = uVar13;
  piVar6 = pGVar3->_priority;
  uVar13 = piVar6[(int)uVar13];
  this->maxprio = uVar13;
  piVar7 = this->inverse;
  for (uVar15 = 0; uVar15 <= uVar13; uVar15 = uVar15 + 1) {
    piVar7[uVar15] = -1;
    uVar13 = this->maxprio;
  }
  puVar4 = (this->outgame)._bits;
  piVar7 = this->strategy;
  piVar8 = this->inverse;
  for (uVar16 = 0; uVar17 = (ulong)this->pos, (long)uVar16 <= (long)uVar17; uVar16 = uVar16 + 1) {
    if ((puVar5[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
      piVar8[piVar6[uVar16]] = (int)uVar16;
      piVar7[uVar16] = -1;
    }
    else {
      puVar1 = puVar4 + (uVar16 >> 6);
      *puVar1 = *puVar1 | 1L << (uVar16 & 0x3f);
    }
  }
  do {
    if ((int)uVar17 < 0) {
      iVar10 = 0;
      while( true ) {
        this->pos = iVar10;
        uVar16 = (ulong)iVar10;
        if (((this->super_Solver).game)->n_vertices <= (long)uVar16) break;
        if ((((this->super_Solver).disabled)->_bits[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
          Solver::solve(&this->super_Solver,iVar10,
                        (uint)(((this->winzero)._bits[uVar16 >> 6] & 1L << (uVar16 & 0x3f)) == 0),
                        this->strategy[uVar16]);
          iVar10 = this->pos;
        }
        iVar10 = iVar10 + 1;
      }
      poVar12 = std::operator<<((this->super_Solver).logger,"solved with ");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      poVar12 = std::operator<<(poVar12," total queries and ");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      poVar12 = std::operator<<(poVar12," total promotions;");
      std::endl<char,std::char_traits<char>>(poVar12);
      poVar12 = std::operator<<((this->super_Solver).logger,"            ");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      poVar12 = std::operator<<(poVar12," max queries and ");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      poVar12 = std::operator<<(poVar12," max promotions;");
      std::endl<char,std::char_traits<char>>(poVar12);
      poVar12 = std::operator<<((this->super_Solver).logger,"            ");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      poVar12 = std::operator<<(poVar12," dominions.");
      std::endl<char,std::char_traits<char>>(poVar12);
      return;
    }
    this->doms = this->doms + 1;
    this->p = this->maxprio;
    this->alpha = this->maxprio & 1;
    (*(this->super_Solver)._vptr_Solver[7])(this);
    bitset::operator|=(&this->outgame,&this->R);
    if (this->alpha == 0) {
      bitset::operator|=(&this->winzero,&this->R);
    }
    uVar13 = this->inverse[this->maxprio];
    uVar16 = (ulong)uVar13;
    uVar15 = 0xffffffff;
    if ((int)uVar13 < -1) {
      uVar15 = uVar13;
    }
    while (iVar10 = (int)uVar16, -1 < iVar10) {
      if (((this->outgame)._bits[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
        this->pos = iVar10;
        this->maxprio = ((this->super_Solver).game)->_priority[uVar16];
        goto LAB_0014e6cd;
      }
      uVar16 = (ulong)(iVar10 - 1);
    }
    this->pos = uVar15;
LAB_0014e6cd:
    this->Pivot = 0;
    this->Top = 0;
    rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->Phase,0);
    *rVar18._M_p = *rVar18._M_p | rVar18._M_mask;
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::clear
              (*(this->Heads).
                super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start);
    pbVar11 = *(this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    puVar4 = pbVar11->_bits;
    sVar9 = pbVar11->_bitssize;
    for (lVar14 = 0; sVar9 << 3 != lVar14; lVar14 = lVar14 + 8) {
      *(undefined8 *)((long)puVar4 + lVar14) = 0;
    }
    std::__cxx11::
    list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::clear(*(this_00->
             super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
             )._M_impl.super__Vector_impl_data._M_start);
    plVar2 = *(this_00->
              super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_Deque_base(&local_88);
    std::__cxx11::
    list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_front(plVar2,(value_type *)&local_88);
    std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_88);
    sVar9 = (this->R)._bitssize;
    puVar4 = (this->R)._bits;
    for (lVar14 = 0; sVar9 << 3 != lVar14; lVar14 = lVar14 + 8) {
      *(undefined8 *)((long)puVar4 + lVar14) = 0;
    }
    uVar17 = (ulong)(uint)this->pos;
  } while( true );
}

Assistant:

void NPPSolver::run()
{

    /* vv Stack initialization vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    Phase.push_back(true);
    Supgame.push_back(&outgame);
    Heads.push_back(new uideque());
    Exits.push_back(new bitset(nodecount()));
    Entries.push_back(new uidlist());
    Entries[0]->push_front(uideque());
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Initialization of pos and maxprio vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    for (pos = nodecount() - 1;; --pos)
    {
        if (disabled[pos])
        {
            outgame[pos] = true;
        }
        else
        {
            maxprio = priority(pos);
            break;
        }
    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Initialization of inverse, outgame, and strategy vvvvvvvvvvvvvvvvvvvv */
    for (uint prt = 0; prt <= maxprio; ++prt)
    {
        inverse[prt] = -1;
    }
    for (int sop = 0; sop <= pos; sop++)
    {
        if (disabled[sop])
        {
            outgame[sop] = true;
        }
        else
        {
            inverse[priority(sop)] = sop;
            strategy[sop] = -1;
        }
    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Main solution cycle vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    while (pos >= 0)
    {

        /* vv Update of the statistic on the number of dominions vvvvvvvvvvvvvvvv */
        doms++;
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Setting of the initial priority and parity vvvvvvvvvvvvvvvvvvvvvvvv */
        p = maxprio;
        alpha = p & 1;
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Call to the search routine and update of the zero winning region vv */
        search();
        outgame |= R;
        if (alpha == 0)
        {
            winzero |= R;
        }
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Search for the new pos and maxprio vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
        for (pos = inverse[maxprio]; pos >= 0 && outgame[pos]; --pos)
        {
        }
        if (pos >= 0) maxprio = priority(pos);
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Stack and current region cleaning vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
        Top = Pivot = 0;
        Phase[0] = true;
        Heads[0]->clear();
        Exits[0]->reset();
        Entries[0]->clear();
        Entries[0]->push_front(uideque());
        R.reset();
        // /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Setting of the final solution vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    for (pos = 0; pos < nodecount(); ++pos)
    {
        if (disabled[pos]) continue;
        Solver::solve(pos, !winzero[pos], strategy[pos]);
    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Printing of statistics vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    logger << "solved with " << totqueries << " total queries and " << totpromos << " total promotions;" << std::endl;
    logger << "            " << maxqueries << " max queries and " << maxpromos << " max promotions;" << std::endl;
    logger << "            " << doms << " dominions." << std::endl;
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */
}